

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O2

ze_result_t zeGetFenceProcAddrTable(ze_api_version_t version,ze_fence_dditable_t *pDdiTable)

{
  undefined8 *puVar1;
  long lVar2;
  ze_pfnFenceCreate_t p_Var3;
  ze_pfnFenceDestroy_t p_Var4;
  ze_pfnFenceQueryStatus_t p_Var5;
  int iVar6;
  ze_result_t zVar7;
  code *pcVar8;
  long lVar9;
  long lVar10;
  long extraout_RDX;
  bool bVar11;
  iterator __begin1;
  undefined8 *puVar12;
  ze_fence_dditable_t dditable;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  ze_pfnFenceReset_t local_38;
  
  puVar12 = *(undefined8 **)(loader::context + 0x15e0);
  puVar1 = *(undefined8 **)(loader::context + 0x15e8);
  if (puVar1 != puVar12) {
    if (pDdiTable == (ze_fence_dditable_t *)0x0) {
      return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    }
    if (*(int *)(loader::context + 0x15c0) < (int)version) {
      return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    }
    bVar11 = false;
    for (; puVar12 != puVar1; puVar12 = puVar12 + 0x1b3) {
      if ((*(int *)(puVar12 + 1) == 0) &&
         (pcVar8 = (code *)dlsym(*puVar12,"zeGetFenceProcAddrTable"), pcVar8 != (code *)0x0)) {
        iVar6 = (*pcVar8)(version,puVar12 + 0x89);
        if (iVar6 == 0) {
          bVar11 = true;
        }
        else {
          *(int *)(puVar12 + 1) = iVar6;
        }
      }
    }
    if (bVar11) {
      lVar2 = *(long *)(loader::context + 0x15e0);
      lVar9 = *(long *)(loader::context + 0x15e8) - lVar2;
      lVar10 = lVar9 % 0xd98;
      if (((ulong)(lVar9 / 0xd98) < 2) && (*(char *)(loader::context + 0x1629) != '\x01')) {
        pDdiTable->pfnReset = *(ze_pfnFenceReset_t *)(lVar2 + 0x468);
        p_Var3 = *(ze_pfnFenceCreate_t *)(lVar2 + 0x448);
        p_Var4 = *(ze_pfnFenceDestroy_t *)(lVar2 + 0x450);
        p_Var5 = *(ze_pfnFenceQueryStatus_t *)(lVar2 + 0x460);
        pDdiTable->pfnHostSynchronize = *(ze_pfnFenceHostSynchronize_t *)(lVar2 + 0x458);
        pDdiTable->pfnQueryStatus = p_Var5;
        pDdiTable->pfnCreate = p_Var3;
        pDdiTable->pfnDestroy = p_Var4;
      }
      else {
        pDdiTable->pfnCreate = loader::zeFenceCreate;
        pDdiTable->pfnDestroy = loader::zeFenceDestroy;
        pDdiTable->pfnHostSynchronize = loader::zeFenceHostSynchronize;
        pDdiTable->pfnQueryStatus = loader::zeFenceQueryStatus;
        pDdiTable->pfnReset = loader::zeFenceReset;
      }
      if (*(long *)(loader::context + 0x1618) != 0) {
        pcVar8 = (code *)dlsym(*(long *)(loader::context + 0x1618),"zeGetFenceProcAddrTable",lVar10)
        ;
        if (pcVar8 == (code *)0x0) {
          return ZE_RESULT_ERROR_UNINITIALIZED;
        }
        zVar7 = (*pcVar8)(version,pDdiTable);
        lVar10 = extraout_RDX;
        if (zVar7 != ZE_RESULT_SUCCESS) {
          return zVar7;
        }
      }
      if (*(long *)(loader::context + 0x1620) == 0) {
        return ZE_RESULT_SUCCESS;
      }
      pcVar8 = (code *)dlsym(*(long *)(loader::context + 0x1620),"zeGetFenceProcAddrTable",lVar10);
      if (pcVar8 != (code *)0x0) {
        local_38 = pDdiTable->pfnReset;
        local_58 = *(undefined4 *)&pDdiTable->pfnCreate;
        uStack_54 = *(undefined4 *)((long)&pDdiTable->pfnCreate + 4);
        uStack_50 = *(undefined4 *)&pDdiTable->pfnDestroy;
        uStack_4c = *(undefined4 *)((long)&pDdiTable->pfnDestroy + 4);
        local_48 = *(undefined4 *)&pDdiTable->pfnHostSynchronize;
        uStack_44 = *(undefined4 *)((long)&pDdiTable->pfnHostSynchronize + 4);
        uStack_40 = *(undefined4 *)&pDdiTable->pfnQueryStatus;
        uStack_3c = *(undefined4 *)((long)&pDdiTable->pfnQueryStatus + 4);
        zVar7 = (*pcVar8)(version,&local_58);
        lVar2 = loader::context;
        *(undefined4 *)(loader::context + 0x1a90) = local_58;
        *(undefined4 *)(lVar2 + 0x1a94) = uStack_54;
        *(undefined4 *)(lVar2 + 0x1a98) = uStack_50;
        *(undefined4 *)(lVar2 + 0x1a9c) = uStack_4c;
        *(undefined4 *)(lVar2 + 0x1aa0) = local_48;
        *(undefined4 *)(lVar2 + 0x1aa4) = uStack_44;
        *(undefined4 *)(lVar2 + 0x1aa8) = uStack_40;
        *(undefined4 *)(lVar2 + 0x1aac) = uStack_3c;
        *(ze_pfnFenceReset_t *)(lVar2 + 0x1ab0) = local_38;
        if (*(char *)(lVar2 + 0x1652) == '\x01') {
          zVar7 = (*pcVar8)(version,pDdiTable);
          return zVar7;
        }
        return zVar7;
      }
      return ZE_RESULT_ERROR_UNINITIALIZED;
    }
  }
  return ZE_RESULT_ERROR_UNINITIALIZED;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetFenceProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_fence_dditable_t* pDdiTable                  ///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->zeDrivers.size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    bool atLeastOneDriverValid = false;
    // Load the device-driver DDI tables
    for( auto& drv : loader::context->zeDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<ze_pfnGetFenceProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zeGetFenceProcAddrTable") );
        if(!getTable) 
            continue; 
        auto getTableResult = getTable( version, &drv.dditable.ze.Fence);
        if(getTableResult == ZE_RESULT_SUCCESS) 
            atLeastOneDriverValid = true;
        else
            drv.initStatus = getTableResult;
    }

    if(!atLeastOneDriverValid)
        result = ZE_RESULT_ERROR_UNINITIALIZED;
    else
        result = ZE_RESULT_SUCCESS;

    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->zeDrivers.size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnCreate                                   = loader::zeFenceCreate;
            pDdiTable->pfnDestroy                                  = loader::zeFenceDestroy;
            pDdiTable->pfnHostSynchronize                          = loader::zeFenceHostSynchronize;
            pDdiTable->pfnQueryStatus                              = loader::zeFenceQueryStatus;
            pDdiTable->pfnReset                                    = loader::zeFenceReset;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->zeDrivers.front().dditable.ze.Fence;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<ze_pfnGetFenceProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zeGetFenceProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    // If the API tracing layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->tracingLayer ))
    {
        auto getTable = reinterpret_cast<ze_pfnGetFenceProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->tracingLayer, "zeGetFenceProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        ze_fence_dditable_t dditable;
        memcpy(&dditable, pDdiTable, sizeof(ze_fence_dditable_t));
        result = getTable( version, &dditable );
        loader::context->tracing_dditable.ze.Fence = dditable;
        if ( loader::context->tracingLayerEnabled ) {
            result = getTable( version, pDdiTable );
        }
    }

    return result;
}